

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O2

BOOL Js::JavascriptOperators::SetPropertyWPCache<int>
               (Var receiver,RecyclableObject *object,int propertyKey,Var newValue,
               ScriptContext *requestContext,PropertyOperationFlags propertyOperationFlags,
               PropertyValueInfo *info)

{
  ImplicitCallFlags *pIVar1;
  code *pcVar2;
  bool bVar3;
  BOOL BVar4;
  int iVar5;
  undefined4 *puVar6;
  RecyclableObject *object_00;
  PolymorphicInlineCache *polymorphicInlineCache;
  UnscopablesWrapperObject *pUVar7;
  JavascriptProxy *this;
  RecyclableObject *pRVar8;
  undefined4 in_register_0000008c;
  undefined1 local_90 [8];
  PropertyDescriptor existingDesc;
  DescriptorFlags local_4c;
  Var pvStack_48;
  DescriptorFlags flags;
  undefined8 local_40;
  JavascriptFunction *local_38;
  Var setterValueOrProxy;
  
  local_40 = CONCAT44(in_register_0000008c,propertyOperationFlags);
  if (receiver == (Var)0x0) {
    return 0;
  }
  pvStack_48 = newValue;
  if (object == (RecyclableObject *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                ,0x9b0,"(object)","object");
    if (!bVar3) goto LAB_009b9bf1;
    *puVar6 = 0;
  }
  bVar3 = TaggedNumber::Is(receiver);
  if (bVar3) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                ,0x9b1,"(!TaggedNumber::Is(receiver))","!TaggedNumber::Is(receiver)"
                               );
    if (!bVar3) goto LAB_009b9bf1;
    *puVar6 = 0;
  }
  local_38 = (JavascriptFunction *)0x0;
  local_4c = None;
  BVar4 = CheckPrototypesForAccessorOrNonWritableProperty
                    (object,propertyKey,&local_38,&local_4c,info,requestContext);
  if (BVar4 == 0) {
    BVar4 = IsObject(receiver);
    if (BVar4 != 0) {
      pRVar8 = VarTo<Js::RecyclableObject>(receiver);
      if ((RecyclableObject *)receiver != object) {
        PropertyDescriptor::PropertyDescriptor((PropertyDescriptor *)local_90);
        BVar4 = GetOwnPropertyDescriptor
                          (pRVar8,propertyKey,requestContext,(PropertyDescriptor *)local_90);
        if ((BVar4 != 0) &&
           (existingDesc.originalVar.ptr._5_1_ != '\0' || existingDesc.originalVar.ptr._4_1_ != '\0'
           )) {
          return 0;
        }
      }
      existingDesc._40_8_ = (object->type).ptr;
      iVar5 = (*(pRVar8->super_FinalizableObject).super_IRecyclerVisitedObject.
                _vptr_IRecyclerVisitedObject[0x17])
                        (pRVar8,(ulong)(uint)propertyKey,pvStack_48,local_40,info);
      if (iVar5 == 0) {
        return 0;
      }
      bVar3 = VarIs<Js::JavascriptProxy>(receiver);
      if (bVar3) {
        return 1;
      }
      if (info->propertyRecordUsageCache == (PropertyRecordUsageCache *)0x0) {
        return 1;
      }
      if (info->flags == InlineCacheSetterFlag) {
        return 1;
      }
      BVar4 = RecyclableObject::IsExternal(object);
      if (BVar4 != 0) {
        return 1;
      }
      object_00 = VarTo<Js::RecyclableObject>(receiver);
      CacheOperators::CachePropertyWrite
                (object_00,false,(Type *)existingDesc._40_8_,
                 ((info->propertyRecordUsageCache->propertyRecord).ptr)->pid,info,requestContext);
      if (info->m_instance != pRVar8) {
        return 1;
      }
      polymorphicInlineCache =
           PropertyRecordUsageCache::GetLdElemInlineCache(info->propertyRecordUsageCache);
      PropertyValueInfo::SetCacheInfo
                (info,polymorphicInlineCache,info->allowResizingPolymorphicInlineCache);
      CacheOperators::CachePropertyRead
                (object,pRVar8,false,((info->propertyRecordUsageCache->propertyRecord).ptr)->pid,
                 false,info,requestContext);
      return 1;
    }
  }
  else {
    if ((local_4c & Accessor) != None) {
      bVar3 = JavascriptError::ThrowIfStrictModeUndefinedSetter
                        ((PropertyOperationFlags)local_40,local_38,requestContext);
      if (bVar3) {
        return 1;
      }
      if (local_38 != (JavascriptFunction *)0x0) {
        bVar3 = VarIs<Js::UnscopablesWrapperObject>(receiver);
        if (bVar3) {
          pUVar7 = UnsafeVarTo<Js::UnscopablesWrapperObject>(receiver);
          receiver = (pUVar7->wrappedObject).ptr;
        }
        else if (((info->propertyRecordUsageCache != (PropertyRecordUsageCache *)0x0) &&
                 (local_38 != (JavascriptFunction *)0x0)) &&
                ((((requestContext->super_ScriptContextBase).javascriptLibrary)->
                 super_JavascriptLibraryBase).defaultAccessorFunction.ptr != local_38)) {
          pRVar8 = VarTo<Js::RecyclableObject>(receiver);
          CacheOperators::CachePropertyWrite
                    (pRVar8,false,(object->type).ptr,
                     ((info->propertyRecordUsageCache->propertyRecord).ptr)->pid,info,requestContext
                    );
        }
        pRVar8 = VarTo<Js::RecyclableObject>(local_38);
        CallSetter(pRVar8,receiver,pvStack_48,requestContext);
        return 1;
      }
      return 1;
    }
    if ((local_4c & Proxy) != None) {
      bVar3 = VarIs<Js::JavascriptProxy>(local_38);
      if (!bVar3) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar6 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                    ,0x9ce,"(VarIs<JavascriptProxy>(setterValueOrProxy))",
                                    "VarIs<JavascriptProxy>(setterValueOrProxy)");
        if (!bVar3) goto LAB_009b9bf1;
        *puVar6 = 0;
      }
      this = VarTo<Js::JavascriptProxy>(local_38);
      if (info->propertyRecordUsageCache != (PropertyRecordUsageCache *)0x0) {
        info->m_instance = (RecyclableObject *)this;
        info->m_propertyIndex = 0xffff;
        info->m_attributes = '\0';
        info->flags = InlineCacheNoFlags;
        *(undefined1 *)&info->cacheInfoFlag = (char)info->cacheInfoFlag | disablePrototypeCacheFlag;
      }
      BVar4 = JavascriptProxy::SetPropertyTrap
                        (this,receiver,SetPropertyWPCacheKind,propertyKey,pvStack_48,requestContext,
                         (PropertyOperationFlags)local_40,0);
      return BVar4;
    }
    if ((local_4c & WritableData) != Data) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar6 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                  ,0x9dc,"((flags & Data) == Data && (flags & Writable) == None)",
                                  "(flags & Data) == Data && (flags & Writable) == None");
      if (!bVar3) {
LAB_009b9bf1:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar6 = 0;
    }
    pIVar1 = &requestContext->threadContext->implicitCallFlags;
    *pIVar1 = *pIVar1 | ImplicitCall_NoOpSet;
  }
  JavascriptError::ThrowCantAssignIfStrictMode((PropertyOperationFlags)local_40,requestContext);
  return 0;
}

Assistant:

BOOL JavascriptOperators::SetPropertyWPCache(Var receiver, RecyclableObject* object, PropertyKeyType propertyKey, Var newValue, ScriptContext* requestContext, PropertyOperationFlags propertyOperationFlags, _Inout_ PropertyValueInfo * info)
    {
        if (receiver)
        {
            AnalysisAssert(object);
            Assert(!TaggedNumber::Is(receiver));
            Var setterValueOrProxy = nullptr;
            DescriptorFlags flags = None;
            if (JavascriptOperators::CheckPrototypesForAccessorOrNonWritableProperty(object, propertyKey, &setterValueOrProxy, &flags, info, requestContext))
            {
                if ((flags & Accessor) == Accessor)
                {
                    if (JavascriptError::ThrowIfStrictModeUndefinedSetter(propertyOperationFlags, setterValueOrProxy, requestContext))
                    {
                        return TRUE;
                    }
                    if (setterValueOrProxy)
                    {
                        if (VarIs<UnscopablesWrapperObject>(receiver))
                        {
                            receiver = (UnsafeVarTo<UnscopablesWrapperObject>(receiver))->GetWrappedObject();
                        }
                        else if (info->GetPropertyRecordUsageCache() && !JavascriptOperators::IsUndefinedAccessor(setterValueOrProxy, requestContext))
                        {
                            CacheOperators::CachePropertyWrite(VarTo<RecyclableObject>(receiver), false, object->GetType(), info->GetPropertyRecordUsageCache()->GetPropertyRecord()->GetPropertyId(), info, requestContext);
                        }
                        RecyclableObject* func = VarTo<RecyclableObject>(setterValueOrProxy);

                        JavascriptOperators::CallSetter(func, receiver, newValue, requestContext);
                    }
                    return TRUE;
                }
                else if ((flags & Proxy) == Proxy)
                {
                    Assert(VarIs<JavascriptProxy>(setterValueOrProxy));
                    JavascriptProxy* proxy = VarTo<JavascriptProxy>(setterValueOrProxy);
                    auto fn = [&](RecyclableObject* target) -> BOOL {
                        return JavascriptOperators::SetPropertyWPCache(receiver, target, propertyKey, newValue, requestContext, propertyOperationFlags, info);
                    };
                    if (info->GetPropertyRecordUsageCache())
                    {
                        PropertyValueInfo::SetNoCache(info, proxy);
                        PropertyValueInfo::DisablePrototypeCache(info, proxy);
                    }
                    return proxy->SetPropertyTrap(receiver, JavascriptProxy::SetPropertyTrapKind::SetPropertyWPCacheKind, propertyKey, newValue, requestContext, propertyOperationFlags);
                }
                else
                {
                    Assert((flags & Data) == Data && (flags & Writable) == None);

                    requestContext->GetThreadContext()->AddImplicitCallFlags(ImplicitCall_NoOpSet);
                    JavascriptError::ThrowCantAssignIfStrictMode(propertyOperationFlags, requestContext);
                    return FALSE;
                }
            }
            else if (!JavascriptOperators::IsObject(receiver))
            {
                JavascriptError::ThrowCantAssignIfStrictMode(propertyOperationFlags, requestContext);
                return FALSE;
            }

            RecyclableObject* receiverObject = VarTo<RecyclableObject>(receiver);
            if (receiver != object)
            {
                // If the receiver object has the property and it is an accessor then return false
                PropertyDescriptor existingDesc;
                if (JavascriptOperators::GetOwnPropertyDescriptor(receiverObject, propertyKey, requestContext, &existingDesc)
                    && existingDesc.IsAccessorDescriptor())
                {
                    return FALSE;
                }
            }

            Type *typeWithoutProperty = object->GetType();
            // in 9.1.9, step 5, we should return false if receiver is not object, and that will happen in default RecyclableObject operation anyhow.
            if (receiverObject->SetProperty(propertyKey, newValue, propertyOperationFlags, info))
            {
                if (!VarIs<JavascriptProxy>(receiver) && info->GetPropertyRecordUsageCache() && info->GetFlags() != InlineCacheSetterFlag && !object->IsExternal())
                {
                    CacheOperators::CachePropertyWrite(VarTo<RecyclableObject>(receiver), false, typeWithoutProperty, info->GetPropertyRecordUsageCache()->GetPropertyRecord()->GetPropertyId(), info, requestContext);

                    if (info->GetInstance() == receiverObject)
                    {
                        PropertyValueInfo::SetCacheInfo(info, info->GetPropertyRecordUsageCache()->GetLdElemInlineCache(), info->AllowResizingPolymorphicInlineCache());
                        CacheOperators::CachePropertyRead(object, receiverObject, false, info->GetPropertyRecordUsageCache()->GetPropertyRecord()->GetPropertyId(), false, info, requestContext);
                    }
                }
                return TRUE;
            }
        }

        return FALSE;
    }